

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O2

IndirOpnd * __thiscall
IR::Instr::HoistMemRefAddress(Instr *this,MemRefOpnd *memRefOpnd,OpCode loadOpCode)

{
  Func *func;
  code *pcVar1;
  bool bVar2;
  AddrOpndKind addrOpndKind;
  undefined4 *puVar3;
  AddrOpnd *pAVar4;
  IndirOpnd *pIVar5;
  RegOpnd *baseOpnd;
  Instr *instr;
  Opnd *this_00;
  void *originalAddress;
  
  if (memRefOpnd == (MemRefOpnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0xa3b,"(memRefOpnd)","memRefOpnd");
    if (!bVar2) goto LAB_0048313c;
    *puVar3 = 0;
  }
  originalAddress = (void *)memRefOpnd->m_memLoc;
  if ((void *)(long)(int)originalAddress == originalAddress) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0xa3d,"(!LowererMDArch::IsLegalMemLoc(memRefOpnd))",
                       "!LowererMDArch::IsLegalMemLoc(memRefOpnd)");
    if (!bVar2) {
LAB_0048313c:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    originalAddress = (void *)memRefOpnd->m_memLoc;
  }
  addrOpndKind = MemRefOpnd::GetAddrKind(memRefOpnd);
  func = this->m_func;
  pAVar4 = AddrOpnd::New((intptr_t)originalAddress,addrOpndKind,func,true,(Var)0x0);
  pIVar5 = Func::GetConstantAddressIndirOpnd
                     (func->topFunc,(intptr_t)originalAddress,&pAVar4->super_Opnd,addrOpndKind,
                      (memRefOpnd->super_Opnd).m_type,loadOpCode);
  if (pIVar5 == (IndirOpnd *)0x0) {
    baseOpnd = RegOpnd::New(TyUint64,func);
    pAVar4 = AddrOpnd::New((intptr_t)originalAddress,addrOpndKind,func,true,(Var)0x0);
    instr = New(loadOpCode,&baseOpnd->super_Opnd,&pAVar4->super_Opnd,func);
    InsertBefore(this,instr);
    pIVar5 = IndirOpnd::New(baseOpnd,0,(memRefOpnd->super_Opnd).m_type,func,true);
    IndirOpnd::SetAddrKind(pIVar5,addrOpndKind,originalAddress);
  }
  this_00 = DeepReplace(this,&memRefOpnd->super_Opnd,&pIVar5->super_Opnd);
  pIVar5 = Opnd::AsIndirOpnd(this_00);
  return pIVar5;
}

Assistant:

IndirOpnd *
Instr::HoistMemRefAddress(MemRefOpnd *const memRefOpnd, const Js::OpCode loadOpCode)
{
    Assert(memRefOpnd);
#if defined(_M_IX86) || defined(_M_X64)
    Assert(!LowererMDArch::IsLegalMemLoc(memRefOpnd));
#endif
    intptr_t address = memRefOpnd->GetMemLoc();
    IR::AddrOpndKind kind = memRefOpnd->GetAddrKind();
    Func *const func = m_func;
    IR::AddrOpnd * addrOpnd = IR::AddrOpnd::New(address, kind, this->m_func, true);
    IR::IndirOpnd * indirOpnd = func->GetTopFunc()->GetConstantAddressIndirOpnd(address, addrOpnd, kind, memRefOpnd->GetType(), loadOpCode);

    if (indirOpnd == nullptr)
    {
        IR::RegOpnd * addressRegOpnd = IR::RegOpnd::New(TyMachPtr, func);
        IR::Instr *const newInstr =
            IR::Instr::New(
            loadOpCode,
            addressRegOpnd,
            IR::AddrOpnd::New(address, kind, func, true),
            func);
        InsertBefore(newInstr);

        indirOpnd = IR::IndirOpnd::New(addressRegOpnd, 0, memRefOpnd->GetType(), func, true);
#if DBG_DUMP
        // TODO: michhol oop jit, make intptr
        indirOpnd->SetAddrKind(kind, (void*)address);
#endif
    }
    return DeepReplace(memRefOpnd, indirOpnd)->AsIndirOpnd();
}